

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_varr_insns(gen_ctx_t gen_ctx,char *title,VARR_bb_insn_t *bb_insns)

{
  bb_insn_t_conflict pbVar1;
  bb_insn_t_conflict bb_insn;
  size_t i;
  VARR_bb_insn_t *bb_insns_local;
  char *title_local;
  gen_ctx_t gen_ctx_local;
  
  fprintf((FILE *)gen_ctx->debug_file,"%s insns:\n",title);
  for (bb_insn = (bb_insn_t_conflict)0x0;
      pbVar1 = (bb_insn_t_conflict)VARR_bb_insn_tlength(bb_insns), bb_insn < pbVar1;
      bb_insn = (bb_insn_t_conflict)((long)&bb_insn->insn + 1)) {
    pbVar1 = VARR_bb_insn_tget(bb_insns,(size_t)bb_insn);
    if (pbVar1 != (bb_insn_t_conflict)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,"  %-5lu",(ulong)pbVar1->index);
      print_bb_insn(gen_ctx,pbVar1,1);
    }
  }
  return;
}

Assistant:

static void print_varr_insns (gen_ctx_t gen_ctx, const char *title, VARR (bb_insn_t) * bb_insns) {
  fprintf (debug_file, "%s insns:\n", title);
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, bb_insns); i++) {
    bb_insn_t bb_insn = VARR_GET (bb_insn_t, bb_insns, i);
    if (bb_insn == NULL) continue;
    fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
    print_bb_insn (gen_ctx, bb_insn, TRUE);
  }
}